

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O2

QString * qt_strippedText(QString *__return_storage_ptr__,QString *s)

{
  int i;
  ulong uVar1;
  
  QString::remove((QLatin1String *)s,3);
  for (uVar1 = 0; uVar1 < (ulong)(s->d).size; uVar1 = uVar1 + 1) {
    if ((s->d).ptr[uVar1] == L'&') {
      QString::remove((longlong)s,uVar1);
    }
  }
  QString::trimmed_helper((QString *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static QString qt_strippedText(QString s)
{
    s.remove("..."_L1);
    for (int i = 0; i < s.size(); ++i) {
        if (s.at(i) == u'&')
            s.remove(i, 1);
    }
    return s.trimmed();
}